

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitruntime.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::JitRuntime::_add(JitRuntime *this,void **dst,CodeHolder *code)

{
  Error EVar1;
  size_t size;
  void *rx;
  JitAllocator *this_00;
  size_t codeSize;
  Span span;
  size_t local_78;
  CodeHolder *local_70;
  Span local_68;
  CodeHolder **local_38;
  undefined1 *local_30;
  
  *dst = (void *)0x0;
  local_70 = code;
  EVar1 = CodeHolder::flatten(code);
  if ((EVar1 == 0) && (EVar1 = CodeHolder::resolveUnresolvedLinks(code), EVar1 == 0)) {
    size = CodeHolder::codeSize(code);
    if (size == 0) {
      EVar1 = 10;
    }
    else {
      local_68._size = 0;
      local_68._block = (void *)0x0;
      local_68._rx = (void *)0x0;
      local_68._rw = (void *)0x0;
      local_68._flags = kNone;
      local_68._reserved = 0;
      this_00 = &this->_allocator;
      EVar1 = JitAllocator::alloc(this_00,&local_68,size);
      if (EVar1 == 0) {
        rx = local_68._rx;
        EVar1 = CodeHolder::relocateToBase(code,(uint64_t)local_68._rx);
        if (EVar1 == 0) {
          local_78 = CodeHolder::codeSize(code);
          if (size < local_78) {
            _add();
            EVar1 = JitAllocator::release((JitAllocator *)&code->_logger,rx);
            return EVar1;
          }
          local_38 = &local_70;
          EVar1 = 0;
          local_30 = (undefined1 *)&local_78;
          JitAllocator::write(this_00,(int)&local_68,
                              JitAllocator::
                              write<asmjit::v1_14::JitRuntime::_add(void**,asmjit::v1_14::CodeHolder*)::$_0>(asmjit::v1_14::JitAllocator::Span&,asmjit::v1_14::JitRuntime::_add(void**,asmjit::v1_14::CodeHolder*)::$_0&&,asmjit::v1_14::VirtMem::CachePolicy)
                              ::{lambda(asmjit::v1_14::JitAllocator::Span&,void*)#1}::Span__void__,
                              (size_t)&local_38);
          *dst = local_68._rx;
        }
        else {
          JitAllocator::release(this_00,local_68._rx);
        }
      }
    }
  }
  return EVar1;
}

Assistant:

Error JitRuntime::_add(void** dst, CodeHolder* code) noexcept {
  *dst = nullptr;

  ASMJIT_PROPAGATE(code->flatten());
  ASMJIT_PROPAGATE(code->resolveUnresolvedLinks());

  size_t estimatedCodeSize = code->codeSize();
  if (ASMJIT_UNLIKELY(estimatedCodeSize == 0))
    return DebugUtils::errored(kErrorNoCodeGenerated);

  JitAllocator::Span span;
  ASMJIT_PROPAGATE(_allocator.alloc(span, estimatedCodeSize));

  // Relocate the code.
  Error err = code->relocateToBase(uintptr_t(span.rx()));
  if (ASMJIT_UNLIKELY(err)) {
    _allocator.release(span.rx());
    return err;
  }

  // Recalculate the final code size and shrink the memory we allocated for it
  // in case that some relocations didn't require records in an address table.
  size_t codeSize = code->codeSize();
  ASMJIT_ASSERT(codeSize <= estimatedCodeSize);

  _allocator.write(span, [&](JitAllocator::Span& span) noexcept -> Error {
    uint8_t* rw = static_cast<uint8_t*>(span.rw());

    for (Section* section : code->_sections) {
      size_t offset = size_t(section->offset());
      size_t bufferSize = size_t(section->bufferSize());
      size_t virtualSize = size_t(section->virtualSize());

      ASMJIT_ASSERT(offset + bufferSize <= span.size());
      memcpy(rw + offset, section->data(), bufferSize);

      if (virtualSize > bufferSize) {
        ASMJIT_ASSERT(offset + virtualSize <= span.size());
        memset(rw + offset + bufferSize, 0, virtualSize - bufferSize);
      }
    }

    span.shrink(codeSize);
    return kErrorOk;
  });

  *dst = span.rx();
  return kErrorOk;
}